

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void __thiscall kratos::InitValueVisitor::visit(InitValueVisitor *this,Generator *gen)

{
  long lVar1;
  long lVar2;
  AssignStmt *local_60;
  undefined1 local_58 [8];
  shared_ptr<kratos::Stmt> stmt;
  shared_ptr<kratos::AssignStmt> assign;
  
  lVar2 = (long)(gen->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(gen->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 4;
    lVar1 = 0;
    do {
      Generator::get_stmt((Generator *)local_58,(uint32_t)gen);
      if (*(int *)((long)local_58 + 0x78) == 3) {
        Stmt::as<kratos::AssignStmt>
                  ((Stmt *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (*(int *)(*(long *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi[0xc]._M_use_count + 0x168) == 3) {
          local_60 = (AssignStmt *)
                     stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
          if ((this->fn_).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->fn_)._M_invoker)((_Any_data *)&this->fn_,&local_60);
        }
        if (assign.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     assign.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
      if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      lVar1 = lVar1 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar1);
  }
  return;
}

Assistant:

void visit(Generator *gen) override {
        uint64_t stmt_count = gen->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = gen->get_stmt(i);
            if (stmt->type() == StatementType::Assign) {
                auto assign = stmt->as<AssignStmt>();
                if (assign->right()->type() == VarType::ConstValue) {
                    fn_(assign.get());
                }
            }
        }
    }